

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darknet2ncnn.cpp
# Opt level: O0

void load_cfg(char *filename,deque<Section_*,_std::allocator<Section_*>_> *dnet)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  string *key_00;
  string *psVar5;
  char *in_RDI;
  string value;
  string key;
  int line_count;
  int section_count;
  size_t pos;
  Section *section;
  ifstream icfg;
  string line;
  Section *in_stack_fffffffffffffc88;
  Section *in_stack_fffffffffffffc90;
  string local_300 [32];
  string *in_stack_fffffffffffffd20;
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  int iVar6;
  int iVar7;
  Section *section_00;
  istream local_238 [520];
  string local_30 [40];
  char *local_8;
  
  local_8 = in_RDI;
  std::__cxx11::string::string(local_30);
  std::ifstream::ifstream(local_238,local_8,_S_in);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"Couldn\'t cfg open file: %s\n",local_8);
    exit(1);
  }
  section_00 = (Section *)0x0;
  iVar6 = 0;
  iVar7 = 0;
LAB_00114d77:
  do {
    do {
      bVar1 = std::ios::eof();
      if (((bVar1 ^ 0xff) & 1) == 0) {
        std::ifstream::close();
        std::ifstream::~ifstream(local_238);
        std::__cxx11::string::~string(local_30);
        return;
      }
      iVar6 = iVar6 + 1;
      std::getline<char,std::char_traits<char>,std::allocator<char>>(local_238,local_30);
      trim(in_stack_fffffffffffffd20);
      lVar3 = std::__cxx11::string::length();
    } while ((lVar3 == 0) ||
            (pcVar4 = (char *)std::__cxx11::string::at((ulong)local_30), *pcVar4 == '#'));
    pcVar4 = (char *)std::__cxx11::string::at((ulong)local_30);
    if (*pcVar4 == '[') {
      std::__cxx11::string::length();
      pcVar4 = (char *)std::__cxx11::string::at((ulong)local_30);
      if (*pcVar4 == ']') {
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)local_280,(ulong)local_30);
        std::__cxx11::string::operator=(local_30,local_280);
        std::__cxx11::string::~string(local_280);
        section_00 = (Section *)operator_new(0x240);
        Section::Section(in_stack_fffffffffffffc90);
        std::__cxx11::string::operator=((string *)section_00,local_30);
        section_00->line_number = iVar6;
        iVar2 = iVar7 + 1;
        section_00->original_layer_count = iVar7;
        std::deque<Section_*,_std::allocator<Section_*>_>::push_back
                  ((deque<Section_*,_std::allocator<Section_*>_> *)in_stack_fffffffffffffc90,
                   (value_type *)in_stack_fffffffffffffc88);
        iVar7 = iVar2;
        goto LAB_00114d77;
      }
    }
    key_00 = (string *)std::__cxx11::string::find_first_of((char)local_30,0x3d);
    if (key_00 != (string *)0xffffffffffffffff) {
      std::__cxx11::string::substr((ulong)local_2a0,(ulong)local_30);
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)local_2c0,(ulong)local_30);
      psVar5 = trim(in_stack_fffffffffffffd20);
      trim(in_stack_fffffffffffffd20);
      in_stack_fffffffffffffc90 =
           (Section *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffffc90,&in_stack_fffffffffffffc88->name);
      in_stack_fffffffffffffc88 = section_00;
      std::__cxx11::string::operator=((string *)in_stack_fffffffffffffc90,(string *)psVar5);
      section_00 = in_stack_fffffffffffffc88;
      std::__cxx11::string::string((string *)&stack0xfffffffffffffd20,local_2a0);
      std::__cxx11::string::string(local_300,local_2c0);
      update_field(section_00,key_00,(string *)CONCAT44(iVar7,iVar6));
      std::__cxx11::string::~string(local_300);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd20);
      std::__cxx11::string::~string(local_2c0);
      std::__cxx11::string::~string(local_2a0);
    }
  } while( true );
}

Assistant:

void load_cfg(const char* filename, std::deque<Section*>& dnet)
{
    std::string line;
    std::ifstream icfg(filename, std::ifstream::in);
    if (!icfg.good())
    {
        fprintf(stderr, "Couldn't cfg open file: %s\n", filename);
        exit(EXIT_FAILURE);
    }

    Section* section = NULL;
    size_t pos;
    int section_count = 0, line_count = 0;
    while (!icfg.eof())
    {
        line_count++;
        std::getline(icfg, line);
        trim(line);
        if (line.length() == 0 || line.at(0) == '#')
            continue;
        if (line.at(0) == '[' && line.at(line.length() - 1) == ']')
        {
            line = line.substr(1, line.length() - 2);
            section = new Section;
            section->name = line;
            section->line_number = line_count;
            section->original_layer_count = section_count++;
            dnet.push_back(section);
        }
        else if ((pos = line.find_first_of('=')) != std::string::npos)
        {
            std::string key = line.substr(0, pos);
            std::string value = line.substr(pos + 1, line.length() - 1);
            section->options[trim(key)] = trim(value);
            update_field(section, key, value);
        }
    }

    icfg.close();
}